

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

int __thiscall
CVmObjByteArray::getp_write_int(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int32_t iVar5;
  undefined8 in_RAX;
  ulong start_idx;
  unsigned_long uStack_40;
  undefined4 uStack_38;
  uchar cbuf [4];
  
  _uStack_38 = in_RAX;
  if ((getp_write_int(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_write_int(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    getp_write_int::desc.min_argc_ = 3;
    getp_write_int::desc.opt_argc_ = 0;
    getp_write_int::desc.varargs_ = 0;
    __cxa_guard_release(&getp_write_int(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_write_int::desc);
  if (iVar2 != 0) {
    return 1;
  }
  uVar3 = CVmBif::pop_int_val();
  uVar4 = CVmBif::pop_int_val();
  iVar5 = CVmBif::pop_long_val();
  if ((uVar4 & 0xf) == 2) {
    uStack_40 = 4;
  }
  else {
    if ((uVar4 & 0xf) != 1) {
      uStack_40 = 1;
      bVar1 = false;
      goto LAB_00265007;
    }
    uStack_40 = 2;
  }
  bVar1 = true;
LAB_00265007:
  if ((uVar3 != 0) &&
     (start_idx = (ulong)uVar3,
     (uStack_40 + start_idx) - 1 <= (ulong)*(uint *)(this->super_CVmObject).ext_)) {
    iVar2 = (int)uStack_40;
    if (iVar2 == 4) {
      _uStack_38 = CONCAT44(iVar5,uStack_38);
    }
    else if (iVar2 == 2) {
      _uStack_38 = CONCAT24((short)iVar5,uStack_38);
    }
    else if (iVar2 == 1) {
      _uStack_38 = CONCAT14((char)iVar5,uStack_38);
    }
    if (bVar1 && (uVar4 & 0xf0) == 0x10) {
      swap_bytes(cbuf,iVar2);
    }
    save_undo(this,self,start_idx,uStack_40);
    copy_from_buf(this,cbuf,start_idx,uStack_40);
    retval->typ = VM_NIL;
    return 1;
  }
  err_throw(0x7df);
}

Assistant:

int CVmObjByteArray::getp_write_int(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(3);
    unsigned int idx;
    unsigned int fmt;
    long val;
    size_t siz;
    unsigned char cbuf[4];

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the starting index, format code, and value to write */
    idx = CVmBif::pop_int_val(vmg0_);
    fmt = CVmBif::pop_int_val(vmg0_);
    val = CVmBif::pop_long_val(vmg0_);

    /* get the size from the format */
    switch (fmt & FmtSizeMask)
    {
    case FmtInt8:
    default:
        siz = 1;
        break;

    case FmtInt16:
        siz = 2;
        break;

    case FmtInt32:
        siz = 4;
        break;
    }

    /* check that the index is in range */
    if (idx < 1 || idx + siz - 1 > get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* write the value to cbuf[] */
    switch (siz)
    {
    case 1:
        /* 8-bit integer */
        cbuf[0] = (char)(val & 0xFF);
        break;

    case 2:
        /* 16-bit integer - start with our standard little-endian format */
        if ((fmt & FmtSignedMask) == FmtSigned)
            oswp2s(cbuf, (int)val);
        else
            oswp2(cbuf, (int)val);
        break;

    case 4:
        /* 32-bit integer - start with our standard little-endian format */
        if ((fmt & FmtSignedMask) == FmtSigned)
            oswp4s(cbuf, val);
        else
            oswp4(cbuf, val);
        break;
    }

    /* swap bytes if they want big-endian */
    if (siz > 1 && (fmt & FmtOrderMask) == FmtBigEndian)
        swap_bytes(cbuf, siz);

    /* save undo for the change */
    save_undo(vmg_ self, idx, siz);

    /* store the byte representation we've constructed */
    copy_from_buf(cbuf, idx, siz);
    
    /* there's no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}